

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::ConditionalConstraint::fromSyntax
          (ConditionalConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *compilation;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ConditionalConstraint *ctrl;
  Constraint *pCVar4;
  socklen_t __len;
  socklen_t __len_00;
  Constraint *elseBody;
  Constraint *local_40;
  ConstraintExprVisitor local_38;
  Expression *args;
  
  compilation = ((context->scope).ptr)->compilation;
  iVar2 = Expression::bind((int)(syntax->condition).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  iVar2 = Constraint::bind((int)(syntax->constraints).ptr,(sockaddr *)context,__len);
  local_40 = (Constraint *)0x0;
  if (syntax->elseClause != (ElseConstraintClauseSyntax *)0x0) {
    iVar3 = Constraint::bind((int)(syntax->elseClause->constraints).ptr,(sockaddr *)context,__len_00
                            );
    local_40 = (Constraint *)CONCAT44(extraout_var_01,iVar3);
  }
  ctrl = BumpAllocator::
         emplace<slang::ast::ConditionalConstraint,slang::ast::Expression_const&,slang::ast::Constraint_const&,slang::ast::Constraint_const*&>
                   (&compilation->super_BumpAllocator,args,
                    (Constraint *)CONCAT44(extraout_var_00,iVar2),&local_40);
  bVar1 = Expression::bad(args);
  if (((!bVar1) && (((Constraint *)CONCAT44(extraout_var_00,iVar2))->kind != Invalid)) &&
     ((local_40 == (Constraint *)0x0 || (local_40->kind != Invalid)))) {
    local_38.failed = false;
    local_38.isTop = true;
    local_38.sawRandVars = false;
    local_38.isSoft = false;
    local_38.context = context;
    bVar1 = Expression::visit<slang::ast::ConstraintExprVisitor&>(args,&local_38);
    if ((bVar1) && (bVar1 = ASTContext::requireBooleanConvertible(context,args), bVar1)) {
      return &ctrl->super_Constraint;
    }
  }
  pCVar4 = Constraint::badConstraint(compilation,&ctrl->super_Constraint);
  return pCVar4;
}

Assistant:

Constraint& ConditionalConstraint::fromSyntax(const ConditionalConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& pred = Expression::bind(*syntax.condition, context);
    auto& ifBody = Constraint::bind(*syntax.constraints, context);

    const Constraint* elseBody = nullptr;
    if (syntax.elseClause)
        elseBody = &Constraint::bind(*syntax.elseClause->constraints, context);

    auto result = comp.emplace<ConditionalConstraint>(pred, ifBody, elseBody);
    if (pred.bad() || ifBody.bad() || (elseBody && elseBody->bad()))
        return badConstraint(comp, result);

    ConstraintExprVisitor visitor(context, /* isSoft */ false);
    if (!pred.visit(visitor) || !context.requireBooleanConvertible(pred))
        return badConstraint(comp, result);

    return *result;
}